

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  string *psVar1;
  ostream *poVar2;
  string outpath;
  string rootpath;
  string local_80;
  string local_60;
  string local_40;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
  if (this->TagType != SUBPROJECT) {
    cmGeneratorTarget::GetDirectory(&local_60,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_60,&this->LocalGenerator->super_cmLocalGenerator,&local_40,&local_80);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    poVar2 = std::operator<<(fout,"    :binDirRelative=\"");
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(fout,"    -o \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->TargetNameReal);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
            (&local_60,this->LocalGenerator,this->GeneratorTarget);
  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  poVar2 = std::operator<<(fout,"    :outputDirRelative=\"");
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2,"\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;
  std::string rootpath = this->LocalGenerator->GetCurrentBinaryDirectory();

  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    outpath = this->GeneratorTarget->GetDirectory(config);
    outpath =
      this->LocalGenerator->MaybeConvertToRelativePath(rootpath, outpath);
    fout << "    :binDirRelative=\"" << outpath << "\"" << std::endl;
    fout << "    -o \"" << this->TargetNameReal << "\"" << std::endl;
  }

  // set target object file destination
  outpath = this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  fout << "    :outputDirRelative=\"" << outpath << "\"" << std::endl;
}